

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

uint32_t __thiscall
cfd::core::ConfidentialTransaction::AddTxIn
          (ConfidentialTransaction *this,Txid *txid,uint32_t index,uint32_t sequence,
          Script *unlocking_script)

{
  wally_tx *tx;
  pointer pCVar1;
  pointer pCVar2;
  Txid *txid_00;
  bool bVar3;
  CfdException *pCVar4;
  uint index_00;
  int ret;
  size_t is_coinbase;
  ConfidentialTxIn txin;
  int local_34c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_348;
  Txid *local_330;
  size_t local_328;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_320;
  ByteData local_308;
  ConfidentialTxIn local_2f0;
  ConfidentialTxIn local_190;
  
  if ((long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->vin_).
            super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x15ffffffea0) {
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x5ec8a3;
    local_2f0.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5ee;
    local_2f0.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "AddTxIn";
    logger::log<>((CfdSourceLocation *)&local_2f0,kCfdLogLevelWarning,"vin maximum.");
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn =
         (_func_int **)&local_2f0.super_AbstractTxIn.txid_.data_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"txin maximum.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_2f0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  tx = (wally_tx *)(this->super_AbstractTransaction).wally_tx_pointer_;
  local_330 = txid;
  Txid::GetData((ByteData *)&local_2f0,txid);
  ByteData::GetBytes(&local_320,(ByteData *)&local_2f0);
  if (local_2f0.super_AbstractTxIn._vptr_AbstractTxIn != (_func_int **)0x0) {
    operator_delete(local_2f0.super_AbstractTxIn._vptr_AbstractTxIn);
  }
  bVar3 = Script::IsEmpty(unlocking_script);
  if (bVar3) {
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (uchar *)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    Script::GetData(&local_308,unlocking_script);
    ByteData::GetBytes(&local_348,&local_308);
    if (local_308.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_308.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  local_34c = wally_tx_add_elements_raw_input
                        (tx,local_320.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                         (long)local_320.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_320.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,index,sequence,
                         local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         (long)local_348.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_348.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_start,
                         (wally_tx_witness_stack *)0x0,(uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,
                         (uchar *)0x0,0,(uchar *)0x0,0,(uchar *)0x0,0,(wally_tx_witness_stack *)0x0,
                         0);
  if (local_34c != 0) {
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn = (_func_int **)0x5ec8a3;
    local_2f0.super_AbstractTxIn.txid_._vptr_Txid._0_4_ = 0x5fe;
    local_2f0.super_AbstractTxIn.txid_.data_.data_.
    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = "AddTxIn";
    logger::log<int&>((CfdSourceLocation *)&local_2f0,kCfdLogLevelWarning,
                      "wally_tx_add_elements_raw_input NG[{}].",&local_34c);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    local_2f0.super_AbstractTxIn._vptr_AbstractTxIn =
         (_func_int **)&local_2f0.super_AbstractTxIn.txid_.data_;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"txin add error.","");
    CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&local_2f0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_328 = 0;
  wally_tx_is_coinbase(tx,&local_328);
  txid_00 = local_330;
  index_00 = index & 0x3fffffff;
  if (local_328 != 0) {
    index_00 = index;
  }
  ConfidentialTxIn::ConfidentialTxIn(&local_2f0,local_330,index_00,sequence);
  bVar3 = Script::IsEmpty(unlocking_script);
  if (!bVar3) {
    ConfidentialTxIn::ConfidentialTxIn(&local_190,txid_00,index_00,sequence,unlocking_script);
    ConfidentialTxIn::operator=(&local_2f0,&local_190);
    ConfidentialTxIn::~ConfidentialTxIn(&local_190);
  }
  ::std::vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>::
  push_back(&this->vin_,&local_2f0);
  pCVar1 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->vin_).
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ConfidentialTxIn::~ConfidentialTxIn(&local_2f0);
  if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_320.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)pCVar2 - (long)pCVar1) >> 5) * -0x45d1745d - 1;
}

Assistant:

uint32_t ConfidentialTransaction::AddTxIn(
    const Txid &txid, uint32_t index, uint32_t sequence,
    const Script &unlocking_script) {
  if (vin_.size() == std::numeric_limits<uint32_t>::max()) {
    warn(CFD_LOG_SOURCE, "vin maximum.");
    throw CfdException(kCfdIllegalStateError, "txin maximum.");
  }

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  const std::vector<uint8_t> &txid_buf = txid.GetData().GetBytes();
  std::vector<uint8_t> empty_data;
  const std::vector<uint8_t> &script_data =
      (unlocking_script.IsEmpty()) ? empty_data
                                   : unlocking_script.GetData().GetBytes();
  int ret = wally_tx_add_elements_raw_input(
      tx_pointer, txid_buf.data(), txid_buf.size(), index, sequence,
      script_data.data(), script_data.size(), NULL, NULL, 0, NULL, 0, NULL, 0,
      NULL, 0, NULL, 0, NULL, 0, NULL, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_add_elements_raw_input NG[{}].", ret);
    throw CfdException(kCfdIllegalStateError, "txin add error.");
  }

  size_t is_coinbase = 0;
  wally_tx_is_coinbase(tx_pointer, &is_coinbase);
  uint32_t set_index = (is_coinbase == 0) ? index & kTxInVoutMask : index;
  ConfidentialTxIn txin(txid, set_index, sequence);
  if (!unlocking_script.IsEmpty()) {
    txin = ConfidentialTxIn(txid, set_index, sequence, unlocking_script);
  }
  vin_.push_back(txin);
  return static_cast<uint32_t>(vin_.size() - 1);
}